

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

string * __thiscall
kratos::get_trigger_attribute_abi_cxx11_
          (string *__return_storage_ptr__,kratos *this,shared_ptr<kratos::StmtBlock> *blk)

{
  size_type sVar1;
  _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  __tmp;
  long *plVar2;
  stringstream local_258 [16];
  undefined1 local_248 [376];
  undefined1 local_d0 [8];
  TriggerConditionVisitor visitor;
  long local_48;
  __node_base local_40 [2];
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_d0 = (undefined1  [8])&PTR_visit_root_002ce9b8;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
       (__node_base_ptr)&visitor.values._M_h._M_rehash_policy._M_next_resize;
  visitor.values._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.values._M_h._M_bucket_count = 0;
  visitor.values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.values._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.values._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.values._M_h._M_rehash_policy._4_4_ = 0;
  visitor.values._M_h._M_rehash_policy._M_next_resize = 0;
  IRVisitor::visit_root((IRVisitor *)local_d0,*(IRNode **)this);
  sVar1 = visitor.values._M_h._M_bucket_count;
  if (visitor.values._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    visitor.values._M_h._M_single_bucket = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&visitor.values._M_h._M_single_bucket," ","");
    std::__cxx11::stringstream::stringstream(local_258);
    if (sVar1 != 0) {
      plVar2 = (long *)sVar1;
      do {
        if (plVar2 != (long *)sVar1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_248,(char *)visitor.values._M_h._M_single_bucket,local_48);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_248,(char *)plVar2[1],plVar2[2]);
        plVar2 = (long *)*plVar2;
      } while (plVar2 != (long *)0x0);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_258);
    std::ios_base::~ios_base((ios_base *)(local_248 + 0x70));
    if (visitor.values._M_h._M_single_bucket != local_40) {
      operator_delete(visitor.values._M_h._M_single_bucket,
                      (ulong)((long)&(local_40[0]._M_nxt)->_M_nxt + 1));
    }
  }
  local_d0 = (undefined1  [8])&PTR_visit_root_002ce9b8;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  local_d0 = (undefined1  [8])&PTR_visit_root_002cc528;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return __return_storage_ptr__;
}

Assistant:

std::string get_trigger_attribute(const std::shared_ptr<StmtBlock> &blk) {
    TriggerConditionVisitor visitor;
    visitor.visit_root(blk.get());
    auto const &values = visitor.values;
    if (values.empty()) return "";
    return string::join(values.begin(), values.end(), " ");
}